

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O3

void mpr_clear_n1_set(avl_tree *set)

{
  list_entity *plVar1;
  list_entity *plVar2;
  
  plVar2 = (set->list_head).next;
  if (plVar2->prev != (set->list_head).prev) {
    do {
      plVar1 = plVar2 + -3;
      plVar2 = plVar2->next;
      avl_remove(set);
      free(&plVar1->prev);
    } while (plVar2->prev != (set->list_head).prev);
  }
  return;
}

Assistant:

void
mpr_clear_n1_set(struct avl_tree *set) {
  struct n1_node *current_node, *node_it;

  avl_for_each_element_safe(set, current_node, _avl_node, node_it) {
    avl_remove(set, &current_node->_avl_node);
    free(current_node);
  }
}